

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask27_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar1 = in[4];
  auVar5 = vpinsrd_avx(ZEXT416(*in),in[1] >> 5,1);
  uVar2 = in[5];
  auVar6 = vpshufd_avx(*(undefined1 (*) [16])(in + 1),0xe9);
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_00197e80);
  auVar6 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 1),_DAT_00198590);
  uVar3 = in[6];
  uVar4 = in[7];
  auVar5 = vpunpcklqdq_avx(auVar5,auVar7);
  auVar5 = vpor_avx(auVar6,auVar5);
  *(undefined1 (*) [16])out = auVar5;
  out[4] = uVar2 << 7 | uVar1 >> 0x14;
  out[5] = uVar4 << 0x1d | uVar3 << 2 | uVar2 >> 0x19;
  out[6] = uVar4 >> 3;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask27_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (27 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (27 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (27 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (27 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++out;
  *out = ((*in)) >> (27 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (27 - 24);
  ++in;

  return out + 1;
}